

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O3

void __thiscall Varnode::copySymbol(Varnode *this,Varnode *vn)

{
  uint4 *puVar1;
  Datatype *pDVar2;
  uint uVar3;
  
  pDVar2 = vn->type;
  this->mapentry = vn->mapentry;
  this->type = pDVar2;
  uVar3 = this->flags & 0xfffffcff;
  this->flags = uVar3;
  this->flags = vn->flags & 0x300 | uVar3;
  if (this->high != (HighVariable *)0x0) {
    puVar1 = &this->high->highflags;
    *(byte *)puVar1 = (byte)*puVar1 | 2;
  }
  return;
}

Assistant:

void Varnode::copySymbol(const Varnode *vn)

{
  type = vn->type;		// Copy any type
  mapentry = vn->mapentry;	// Copy any symbol
  flags &= ~(Varnode::typelock | Varnode::namelock);
  flags |= (Varnode::typelock | Varnode::namelock) & vn->flags;
  if (high != (HighVariable *)0)
    high->typeDirty();
}